

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::header(ostream *out,elfio *reader)

{
  uchar uVar1;
  byte bVar2;
  Elf_Half EVar3;
  Elf_Word EVar4;
  ostream *poVar5;
  void *pvVar6;
  Elf64_Addr EVar7;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  elfio *local_18;
  elfio *reader_local;
  ostream *out_local;
  
  local_18 = reader;
  reader_local = (elfio *)out;
  EVar3 = elfio::get_header_size(reader);
  if (EVar3 != 0) {
    poVar5 = std::operator<<((ostream *)reader_local,"ELF Header");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  Class:      ");
    uVar1 = elfio::get_class(local_18);
    str_class<unsigned_char>(&local_38,uVar1);
    poVar5 = std::operator<<(poVar5,(string *)&local_38);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  Encoding:   ");
    uVar1 = elfio::get_encoding(local_18);
    str_endian<unsigned_char>(&local_68,uVar1);
    poVar5 = std::operator<<(poVar5,(string *)&local_68);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  ELFVersion: ");
    uVar1 = elfio::get_elf_version(local_18);
    str_version<unsigned_char>(&local_88,uVar1);
    poVar5 = std::operator<<(poVar5,(string *)&local_88);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  OS/ABI:     ");
    uVar1 = elfio::get_os_abi(local_18);
    str_os_abi<unsigned_char>(&local_a8,uVar1);
    poVar5 = std::operator<<(poVar5,(string *)&local_a8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  ABI Version:");
    bVar2 = elfio::get_abi_version(local_18);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,(uint)bVar2);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  Type:       ");
    EVar3 = elfio::get_type(local_18);
    str_type<unsigned_short>(&local_c8,EVar3);
    poVar5 = std::operator<<(poVar5,(string *)&local_c8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  Machine:    ");
    EVar3 = elfio::get_machine(local_18);
    str_machine<unsigned_short>(&local_e8,EVar3);
    poVar5 = std::operator<<(poVar5,(string *)&local_e8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  Version:    ");
    EVar4 = elfio::get_version(local_18);
    str_version<unsigned_int>(&local_108,EVar4);
    poVar5 = std::operator<<(poVar5,(string *)&local_108);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  Entry:      ");
    poVar5 = std::operator<<(poVar5,"0x");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
    EVar7 = elfio::get_entry(local_18);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,EVar7);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"  Flags:      ");
    poVar5 = std::operator<<(poVar5,"0x");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
    EVar4 = elfio::get_flags(local_18);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,EVar4);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

static void header( std::ostream& out, const elfio& reader )
    {
        if ( !reader.get_header_size() ) {
            return;
        }
        out << "ELF Header" << std::endl
            << std::endl
            << "  Class:      " << str_class( reader.get_class() ) << std::endl
            << "  Encoding:   " << str_endian( reader.get_encoding() )
            << std::endl
            << "  ELFVersion: " << str_version( reader.get_elf_version() )
            << std::endl
            << "  OS/ABI:     " << str_os_abi( reader.get_os_abi() )
            << std::endl
            << "  ABI Version:" << (int)reader.get_abi_version() << std::endl
            << "  Type:       " << str_type( reader.get_type() ) << std::endl
            << "  Machine:    " << str_machine( reader.get_machine() )
            << std::endl
            << "  Version:    " << str_version( reader.get_version() )
            << std::endl
            << "  Entry:      " << "0x" << std::hex << reader.get_entry()
            << std::endl
            << "  Flags:      " << "0x" << std::hex << reader.get_flags()
            << std::endl
            << std::endl;
    }